

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O0

int Sat_MemCompactLearned(Sat_Mem_t *p,int fDoMove)

{
  bool bVar1;
  cla cVar2;
  cla cVar3;
  int iVar4;
  uint uVar5;
  clause cVar6;
  uint uVar7;
  clause cVar8;
  clause *c_00;
  bool bVar9;
  clause local_4c;
  int hLimit;
  int Counter;
  int fStartLooking;
  int nInts;
  int kNew;
  int iNew;
  int k;
  int i;
  clause *cPivot;
  clause *c;
  int fDoMove_local;
  Sat_Mem_t *p_local;
  
  _k = (clause *)0x0;
  nInts = 1;
  fStartLooking = 2;
  local_4c = (clause)0x0;
  cVar2 = Sat_MemHandCurrent(p,1);
  cVar3 = Sat_MemHand(p,1,2);
  if (cVar2 == cVar3) {
    p_local._4_4_ = (clause)0x0;
  }
  else {
    if ((fDoMove != 0) && (p->BookMarkH[1] != 0)) {
      iVar4 = p->BookMarkH[1];
      cVar3 = Sat_MemHand(p,1,2);
      if ((iVar4 < cVar3) || (cVar2 < p->BookMarkH[1])) {
        __assert_fail("p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                      ,0x179,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
      }
      _k = Sat_MemClauseHand(p,p->BookMarkH[1]);
      if ((p->BookMarkH[1] < cVar2) && (((uint)*_k >> 1 & 1) == 0)) {
        *(clause *)(p->BookMarkH + 1) = _k[(ulong)((uint)*_k >> 0xb) + 1];
        _k = (clause *)0x0;
      }
    }
    bVar1 = false;
    for (iNew = 1; iNew <= p->iPage[1]; iNew = iNew + 2) {
      kNew = 2;
      while( true ) {
        iVar4 = Sat_MemLimit(p->pPages[iNew]);
        bVar9 = false;
        if (kNew < iVar4) {
          cPivot = Sat_MemClause(p,iNew,kNew);
          bVar9 = cPivot != (clause *)0x0;
        }
        if (!bVar9) break;
        if (((uint)*cPivot & 1) == 0) {
          __assert_fail("c->lrn",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x187,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
        }
        if (((uint)*cPivot >> 1 & 1) == 0) {
          if (bVar1) {
            bVar1 = false;
            *(clause *)(p->BookMarkH + 1) = cPivot[(ulong)((uint)*cPivot >> 0xb) + 1];
          }
          uVar5 = Sat_MemClauseSize(cPivot);
          if ((uVar5 & 1) != 0) {
            __assert_fail("!(nInts & 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x19b,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
          }
          if (1 << ((byte)p->nPageSize & 0x1f) <= (int)(fStartLooking + uVar5)) {
            if (fDoMove != 0) {
              Sat_MemWriteLimit(p->pPages[nInts],fStartLooking);
            }
            nInts = nInts + 2;
            fStartLooking = 2;
          }
          if (fDoMove == 0) {
            cVar8 = (clause)Sat_MemHand(p,nInts,fStartLooking);
            cPivot[(ulong)((uint)*cPivot >> 0xb) + 1] = cVar8;
          }
          else {
            cVar8 = cPivot[(ulong)((uint)*cPivot >> 0xb) + 1];
            cVar6 = (clause)Sat_MemHand(p,nInts,fStartLooking);
            if (cVar8 != cVar6) {
              __assert_fail("c->lits[c->size] == Sat_MemHand(p, iNew, kNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                            ,0x1a9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
            }
            if ((iNew != nInts) || (kNew != fStartLooking)) {
              memmove(p->pPages[nInts] + fStartLooking,cPivot,(long)(int)uVar5 << 2);
              cPivot = (clause *)(p->pPages[nInts] + fStartLooking);
              uVar7 = Sat_MemClauseSize(cPivot);
              if (uVar5 != uVar7) {
                __assert_fail("nInts == Sat_MemClauseSize(c)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                              ,0x1b0,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
              }
            }
            cPivot[(ulong)((uint)*cPivot >> 0xb) + 1] = local_4c;
          }
          fStartLooking = uVar5 + fStartLooking;
          if ((iNew < nInts) || (1 << ((byte)p->nPageSize & 0x1f) <= fStartLooking)) {
            __assert_fail("iNew <= i && kNew < (1 << p->nPageSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x1b9,"int Sat_MemCompactLearned(Sat_Mem_t *, int)");
          }
          local_4c = (clause)((int)local_4c + 1);
        }
        else if ((_k != (clause *)0x0) && (_k == cPivot)) {
          bVar1 = true;
          _k = (clause *)0x0;
        }
        iVar4 = Sat_MemClauseSize(cPivot);
        kNew = iVar4 + kNew;
      }
    }
    if (fDoMove != 0) {
      *(clause *)(p->nEntries + 1) = local_4c;
      p->iPage[1] = nInts;
      Sat_MemWriteLimit(p->pPages[nInts],fStartLooking);
      if (p->BookMarkH[1] != 0) {
        if (_k == (clause *)0x0) {
          c_00 = Sat_MemClauseHand(p,p->BookMarkH[1]);
          iVar4 = clause_id(c_00);
          p->BookMarkE[1] = iVar4;
        }
        else {
          cVar2 = Sat_MemHandCurrent(p,1);
          p->BookMarkH[1] = cVar2;
          p->BookMarkE[1] = p->nEntries[1];
        }
      }
    }
    p_local._4_4_ = local_4c;
  }
  return (int)p_local._4_4_;
}

Assistant:

static inline int Sat_MemCompactLearned( Sat_Mem_t * p, int fDoMove )
{
    clause * c, * cPivot = NULL;
    int i, k, iNew = 1, kNew = 2, nInts, fStartLooking, Counter = 0;
    int hLimit = Sat_MemHandCurrent(p, 1);
    if ( hLimit == Sat_MemHand(p, 1, 2) )
        return 0;
    if ( fDoMove && p->BookMarkH[1] )
    {
        // move the pivot
        assert( p->BookMarkH[1] >= Sat_MemHand(p, 1, 2) && p->BookMarkH[1] <= hLimit );
        // get the pivot and remember it may be pointed offlimit
        cPivot = Sat_MemClauseHand( p, p->BookMarkH[1] );
        if ( p->BookMarkH[1] < hLimit && !cPivot->mark )
        {
            p->BookMarkH[1] = cPivot->lits[cPivot->size];
            cPivot = NULL;
        }
        // else find the next used clause after cPivot
    }
    // iterate through the learned clauses
    fStartLooking = 0;
    Sat_MemForEachLearned( p, c, i, k )
    {
        assert( c->lrn );
        // skip marked entry
        if ( c->mark )
        {
            // if pivot is a marked clause, start looking for the next non-marked one
            if ( cPivot && cPivot == c )
            {
                fStartLooking = 1;
                cPivot = NULL;
            }
            continue;
        }
        // if we started looking before, we found it!
        if ( fStartLooking )
        {
            fStartLooking = 0;
            p->BookMarkH[1] = c->lits[c->size];
        }
        // compute entry size
        nInts = Sat_MemClauseSize(c);
        assert( !(nInts & 1) );
        // check if we need to scroll to the next page
        if ( kNew + nInts >= (1 << p->nPageSize) )
        {
            // set the limit of the current page
            if ( fDoMove )
                Sat_MemWriteLimit( p->pPages[iNew], kNew );
            // move writing position to the new page
            iNew += 2;
            kNew = 2;
        }
        if ( fDoMove )
        {
            // make sure the result is the same as previous dry run
            assert( c->lits[c->size] == Sat_MemHand(p, iNew, kNew) );
            // only copy the clause if it has changed
            if ( i != iNew || k != kNew )
            {
                memmove( p->pPages[iNew] + kNew, c, sizeof(int) * nInts );
//                c = Sat_MemClause( p, iNew, kNew ); // assersions do not hold during dry run
                c = (clause *)(p->pPages[iNew] + kNew);
                assert( nInts == Sat_MemClauseSize(c) );
            }
            // set the new ID value
            c->lits[c->size] = Counter;
        }
        else // remember the address of the clause in the new location
            c->lits[c->size] = Sat_MemHand(p, iNew, kNew);
        // update writing position
        kNew += nInts;
        assert( iNew <= i && kNew < (1 << p->nPageSize) );
        // update counter
        Counter++;
    }
    if ( fDoMove )
    {
        // update the counter
        p->nEntries[1] = Counter;
        // update the page count
        p->iPage[1] = iNew;
        // set the limit of the last page
        Sat_MemWriteLimit( p->pPages[iNew], kNew );
        // check if the pivot need to be updated
        if ( p->BookMarkH[1] )
        {
            if ( cPivot )
            {
                p->BookMarkH[1] = Sat_MemHandCurrent(p, 1);
                p->BookMarkE[1] = p->nEntries[1];
            }
            else
                p->BookMarkE[1] = clause_id(Sat_MemClauseHand( p, p->BookMarkH[1] ));
        }

    }
    return Counter;
}